

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getBaseTwist(KinDynComputations *this,Span<double,__1L> base_velocity)

{
  pointer local_a0;
  undefined8 local_98;
  Matrix<double,_6,_1,_0,_6,_1> local_88;
  KinDynComputations local_50 [3];
  
  if (base_velocity.storage_.super_extent_type<_1L>.size_.size_ == 6) {
    getBaseTwist(local_50);
    toEigen(&local_88,(SpatialMotionVector *)local_50);
    local_98 = 6;
    local_a0 = base_velocity.storage_.data_;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,6,1,0,6,1>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a0,
               &local_88);
  }
  else {
    iDynTree::reportError("KinDynComputations","getRobotState","Wrong size in input base_velocity");
  }
  return base_velocity.storage_.super_extent_type<_1L>.size_.size_ == 6;
}

Assistant:

bool KinDynComputations::getBaseTwist(Span<double> base_velocity) const
{
    constexpr int expected_twist_size = 6;
    bool ok = base_velocity.size() == expected_twist_size;
    if( !ok )
    {
        reportError("KinDynComputations","getRobotState","Wrong size in input base_velocity");
        return false;
    }

    toEigen(base_velocity) = toEigen(getBaseTwist());
    return true;
}